

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void expr_emit_binary(Parser *psr,Tk binop,Node *left,Node right)

{
  Node right_00;
  Node right_01;
  Node right_02;
  Node right_03;
  Node *left_local;
  Tk binop_local;
  Parser *psr_local;
  Node right_local;
  
  right_00.field_1 = right.field_1;
  right_00.type = right.type;
  if (((binop - 0x2aU < 2) || (binop == 0x2d)) || (binop == 0x2f)) {
    right_00._4_4_ = 0;
    expr_emit_arith(psr,binop,left,right_00);
  }
  else if (((binop == 0x3c) || (binop == 0x3e)) || (binop - 0x106U < 4)) {
    right_01._4_4_ = 0;
    right_01.type = right_00.type;
    right_01.field_1.num = right_00.field_1.num;
    expr_emit_rel(psr,binop,left,right_01);
  }
  else if (binop == 0x10a) {
    right_02._4_4_ = 0;
    right_02.type = right_00.type;
    right_02.field_1.num = right_00.field_1.num;
    expr_emit_and(psr,left,right_02);
  }
  else {
    if (binop != 0x10b) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                    ,0x3de,"void expr_emit_binary(Parser *, Tk, Node *, Node)");
    }
    right_03._4_4_ = 0;
    right_03.type = right_00.type;
    right_03.field_1.num = right_00.field_1.num;
    expr_emit_or(psr,left,right_03);
  }
  return;
}

Assistant:

static void expr_emit_binary(Parser *psr, Tk binop, Node *left, Node right) {
	switch (binop) {
		// Arithmetic operators
	case '+': case '-': case '*': case '/':
		expr_emit_arith(psr, binop, left, right);
		break;

		// Relational operators
	case TK_EQ: case TK_NEQ: case '>': case TK_GE: case '<': case TK_LE:
		expr_emit_rel(psr, binop, left, right);
		break;

		// Logical operators
	case TK_AND:
		expr_emit_and(psr, left, right);
		break;
	case TK_OR:
		expr_emit_or(psr, left, right);
		break;

	default:
		UNREACHABLE();
	}
}